

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

int __thiscall
QAccessibleTabBar::select
          (QAccessibleTabBar *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  int index;
  undefined8 uVar1;
  QTabBar *this_00;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  
  uVar1 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x58))
                    (this,CONCAT44(in_register_00000034,__nfds));
  index = (int)uVar1;
  if (-1 < index) {
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    this_00 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
    QTabBar::setCurrentIndex(this_00,index);
    uVar1 = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)uVar1 >> 8),-1 < index);
}

Assistant:

bool QAccessibleTabBar::select(QAccessibleInterface *childItem)
{
    const int childIndex = indexOfChild(childItem);
    if (childIndex >= 0) {
        tabBar()->setCurrentIndex(childIndex);
        return true;
    }
    return false;
}